

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfold.cpp
# Opt level: O1

int __thiscall ncnn::Unfold::forward(Unfold *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 *puVar16;
  int iVar17;
  int iVar18;
  undefined4 *puVar19;
  bool bVar20;
  Option opt_b;
  ulong local_108;
  Mat local_e8;
  long local_a0;
  void *local_98;
  long local_90;
  void *local_88;
  long local_80;
  Option local_78;
  
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_78.num_threads = opt->num_threads;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar14._0_1_ = opt->use_bf16_storage;
  uVar14._1_1_ = opt->use_fp16_packed;
  uVar14._2_1_ = opt->use_fp16_storage;
  uVar14._3_1_ = opt->use_fp16_arithmetic;
  uVar14._4_1_ = opt->use_int8_packed;
  uVar14._5_1_ = opt->use_int8_storage;
  uVar14._6_1_ = opt->use_int8_arithmetic;
  uVar14._7_1_ = opt->use_packing_layout;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_basic = opt->use_subgroup_basic;
  local_78.use_subgroup_vote = opt->use_subgroup_vote;
  local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
  local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_reserved_0 = opt->use_reserved_0;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_shader_local_memory = opt->use_shader_local_memory;
  local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
  local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
  local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
  local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
  local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  local_78.use_reserved_7 = opt->use_reserved_7;
  local_78.use_reserved_8 = opt->use_reserved_8;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78.blob_allocator = opt->workspace_allocator;
  local_78._32_8_ = uVar14 & 0xffffffffffffff;
  make_padding(this,bottom_blob,&local_e8,&local_78);
  iVar1 = local_e8.c;
  iVar9 = local_e8.w;
  if (local_e8.data != (void *)0x0) {
    iVar10 = -100;
    if ((long)local_e8.c * local_e8.cstep == 0) goto LAB_0058d4f5;
    uVar14 = (ulong)(uint)local_e8.c;
    iVar6 = (~((this->kernel_w + -1) * this->dilation_w) + local_e8.w) / this->stride_w;
    iVar7 = (~((this->kernel_h + -1) * this->dilation_h) + local_e8.h) / this->stride_h;
    iVar12 = iVar6 + 1;
    iVar17 = this->kernel_h * this->kernel_w;
    Mat::create(top_blob,(iVar7 + 1) * iVar12,iVar17 * local_e8.c,
                CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize),opt->blob_allocator)
    ;
    if (top_blob->data != (void *)0x0) {
      iVar10 = -100;
      if ((long)top_blob->c * top_blob->cstep != 0) {
        if (iVar1 < 1) {
          iVar10 = 0;
        }
        else {
          iVar1 = this->stride_h;
          iVar10 = this->stride_w;
          local_88 = local_e8.data;
          local_90 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
          local_98 = top_blob->data;
          uVar2 = this->kernel_w;
          uVar3 = this->kernel_h;
          local_80 = (long)local_e8.w *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
          local_a0 = (long)iVar17 * (long)top_blob->w * top_blob->elemsize;
          local_108 = 0;
          do {
            if (0 < (int)uVar3) {
              puVar19 = (undefined4 *)(local_108 * local_a0 + (long)local_98);
              iVar17 = this->dilation_h;
              iVar4 = this->dilation_w;
              uVar11 = 0;
              do {
                if (0 < (int)uVar2) {
                  uVar15 = 0;
                  do {
                    if (-1 < iVar7) {
                      puVar16 = (undefined4 *)
                                ((long)local_e8.data +
                                uVar15 * (long)iVar4 * 4 +
                                uVar11 * iVar17 * local_80 + local_90 * local_108);
                      iVar5 = this->stride_w;
                      iVar18 = 0;
                      do {
                        iVar13 = iVar12;
                        if (-1 < iVar6) {
                          do {
                            *puVar19 = *puVar16;
                            puVar19 = puVar19 + 1;
                            puVar16 = puVar16 + iVar5;
                            iVar13 = iVar13 + -1;
                          } while (iVar13 != 0);
                        }
                        puVar16 = puVar16 + (iVar9 * iVar1 - iVar10 * iVar12);
                        bVar20 = iVar18 != iVar7;
                        iVar18 = iVar18 + 1;
                      } while (bVar20);
                    }
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != uVar2);
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 != uVar3);
            }
            local_108 = local_108 + 1;
          } while (local_108 != uVar14);
          iVar10 = 0;
        }
      }
      goto LAB_0058d4f5;
    }
  }
  iVar10 = -100;
LAB_0058d4f5:
  piVar8 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int Unfold::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        opt_b.use_packing_layout = false;
        make_padding(bottom_blob, bottom_blob_bordered, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;
    }

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const int channels = bottom_blob_bordered.c;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    const int size = outw * outh;
    const int maxk = kernel_w * kernel_h;

    top_blob.create(size, maxk * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // im2col
    const int gap = w * stride_h - outw * stride_w;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const Mat img = bottom_blob_bordered.channel(p);
        float* ptr = top_blob.row(p * maxk);

        for (int u = 0; u < kernel_h; u++)
        {
            for (int v = 0; v < kernel_w; v++)
            {
                const float* sptr = img.row(dilation_h * u) + dilation_w * v;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        ptr[0] = sptr[0];

                        sptr += stride_w;
                        ptr += 1;
                    }

                    sptr += gap;
                }
            }
        }
    }

    return 0;
}